

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffs2dt(char *datestr,int *year,int *month,int *day,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ushort **ppuVar5;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  char *in_RDI;
  int *in_R8;
  int lday;
  int lmonth;
  int lyear;
  int slen;
  int *in_stack_00000050;
  int in_stack_00000058;
  int in_stack_0000005c;
  int in_stack_00000060;
  int local_4;
  
  if (*in_R8 < 1) {
    if (in_RSI != (int *)0x0) {
      *in_RSI = 0;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
    if (in_RDI == (char *)0x0) {
      ffpmsg((char *)0x249964);
      *in_R8 = 0x1a4;
      local_4 = 0x1a4;
    }
    else {
      sVar4 = strlen(in_RDI);
      iVar1 = (int)sVar4;
      if (((iVar1 == 8) && (in_RDI[2] == '/')) && (in_RDI[5] == '/')) {
        ppuVar5 = __ctype_b_loc();
        if ((((((*ppuVar5)[(int)*in_RDI] & 0x800) == 0) ||
             (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[1]] & 0x800) == 0)) ||
            (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[3]] & 0x800) == 0)) ||
           (((ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[4]] & 0x800) == 0 ||
             (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[6]] & 0x800) == 0)) ||
            (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[7]] & 0x800) == 0)))) {
          ffpmsg((char *)0x249b16);
          ffpmsg((char *)0x249b20);
          *in_R8 = 0x1a4;
          return 0x1a4;
        }
        iVar1 = atoi(in_RDI + 6);
        iVar2 = atoi(in_RDI + 3);
        iVar3 = atoi(in_RDI);
        if (in_RSI != (int *)0x0) {
          *in_RSI = iVar1 + 0x76c;
        }
        if (in_RDX != (int *)0x0) {
          *in_RDX = iVar2;
        }
        if (in_RCX != (int *)0x0) {
          *in_RCX = iVar3;
        }
      }
      else {
        if (((iVar1 < 10) || (in_RDI[4] != '-')) || (in_RDI[7] != '-')) {
          ffpmsg((char *)0x249d84);
          ffpmsg((char *)0x249d8e);
          *in_R8 = 0x1a4;
          return 0x1a4;
        }
        ppuVar5 = __ctype_b_loc();
        if (((((*ppuVar5)[(int)*in_RDI] & 0x800) == 0) ||
            (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[1]] & 0x800) == 0)) ||
           ((ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[2]] & 0x800) == 0 ||
            ((((ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[3]] & 0x800) == 0 ||
               (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[5]] & 0x800) == 0)) ||
              (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[6]] & 0x800) == 0)) ||
             ((ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[8]] & 0x800) == 0 ||
              (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)in_RDI[9]] & 0x800) == 0)))))))) {
          ffpmsg((char *)0x249d57);
          ffpmsg((char *)0x249d61);
          *in_R8 = 0x1a4;
          return 0x1a4;
        }
        if ((10 < iVar1) && (in_RDI[10] != 'T')) {
          ffpmsg((char *)0x249cbc);
          ffpmsg((char *)0x249cc6);
          *in_R8 = 0x1a4;
          return 0x1a4;
        }
        iVar1 = atoi(in_RDI);
        iVar2 = atoi(in_RDI + 5);
        iVar3 = atoi(in_RDI + 8);
        if (in_RSI != (int *)0x0) {
          *in_RSI = iVar1;
        }
        if (in_RDX != (int *)0x0) {
          *in_RDX = iVar2;
        }
        if (in_RCX != (int *)0x0) {
          *in_RCX = iVar3;
        }
      }
      iVar1 = ffverifydate(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      if (0 < iVar1) {
        ffpmsg((char *)0x249dcc);
      }
      local_4 = *in_R8;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffs2dt(char *datestr,   /* I - date string: "YYYY-MM-DD" or "dd/mm/yy" */
           int *year,       /* O - year (0 - 9999)                         */
           int *month,      /* O - month (1 - 12)                          */
           int *day,        /* O - day (1 - 31)                            */
           int   *status)   /* IO - error status                           */
/*
  Parse a date character string into year, month, and day values
*/
{
    int slen, lyear, lmonth, lday;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (year)
        *year = 0;
    if (month)
        *month = 0;
    if (day)
        *day   = 0;

    if (!datestr)
    {
        ffpmsg("error: null input date string (ffs2dt)");
        return(*status = BAD_DATE);   /* Null datestr pointer ??? */
    }

    slen = strlen(datestr);

    if (slen == 8 && datestr[2] == '/' && datestr[5] == '/')
    {
        if (isdigit((int) datestr[0]) && isdigit((int) datestr[1])
         && isdigit((int) datestr[3]) && isdigit((int) datestr[4])
         && isdigit((int) datestr[6]) && isdigit((int) datestr[7]) )
        {
            /* this is an old format string: "dd/mm/yy" */
            lyear  = atoi(&datestr[6]) + 1900;
            lmonth = atoi(&datestr[3]);
	    lday   = atoi(datestr);
	    
            if (year)
                *year = lyear;
            if (month)
                *month = lmonth;
            if (day)
                *day   = lday;
        }
        else
        {
            ffpmsg("input date string has illegal format (ffs2dt):");
            ffpmsg(datestr);
            return(*status = BAD_DATE);
        }
    }
    else if (slen >= 10 && datestr[4] == '-' && datestr[7] == '-')
        {
        if (isdigit((int) datestr[0]) && isdigit((int) datestr[1])
         && isdigit((int) datestr[2]) && isdigit((int) datestr[3])
         && isdigit((int) datestr[5]) && isdigit((int) datestr[6])
         && isdigit((int) datestr[8]) && isdigit((int) datestr[9]) )
        {
            if (slen > 10 && datestr[10] != 'T')
            {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
            }

            /* this is a new format string: "yyyy-mm-dd" */
            lyear  = atoi(datestr);
            lmonth = atoi(&datestr[5]);
            lday   = atoi(&datestr[8]);

            if (year)
               *year  = lyear;
            if (month)
               *month = lmonth;
            if (day)
               *day   = lday;
        }
        else
        {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
        }
    }
    else
    {
                ffpmsg("input date string has illegal format (ffs2dt):");
                ffpmsg(datestr);
                return(*status = BAD_DATE);
    }


    if (ffverifydate(lyear, lmonth, lday, status) > 0)
    {
        ffpmsg("invalid date (ffs2dt)");
    }

    return(*status);
}